

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O1

bool __thiscall AKey::HandlePickup(AKey *this,AInventory *item)

{
  PClass *pPVar1;
  AInventory *pAVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (multiplayer) {
    bVar3 = AInventory::HandlePickup(&this->super_AInventory,item);
    return bVar3;
  }
  if ((this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar5 = (**(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
                      (this);
    (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar5);
  }
  pPVar1 = (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
  if ((item->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar5 = (**(item->super_AActor).super_DThinker.super_DObject._vptr_DObject)(item);
    (item->super_AActor).super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var_00,iVar5);
  }
  if (pPVar1 == (item->super_AActor).super_DThinker.super_DObject.Class) {
    *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
    bVar3 = true;
  }
  else {
    pAVar2 = (this->super_AInventory).super_AActor.Inventory.field_0.p;
    if (pAVar2 != (AInventory *)0x0) {
      if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar2 = (this->super_AInventory).super_AActor.Inventory.field_0.p;
        uVar4 = (*(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37])
                          (pAVar2,item);
        return (bool)uVar4;
      }
      (this->super_AInventory).super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AKey::HandlePickup (AInventory *item)
{
	// In single player, you can pick up an infinite number of keys
	// even though you can only hold one of each.
	if (multiplayer)
	{
		return Super::HandlePickup (item);
	}
	if (GetClass() == item->GetClass())
	{
		item->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}